

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall
chatra::RuntimeImp::push
          (RuntimeImp *this,InstanceId interactiveInstanceId,string *scriptName,string *statement)

{
  uint32_t *puVar1;
  __atomic_flag_data_type _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  Instance *pIVar5;
  _Hash_node_base *p_Var6;
  Package *__args_1;
  _Fwd_list_node_base *p_Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  UnsupportedOperationException *this_00;
  undefined8 *puVar9;
  Node *__tmp;
  Thread *__args;
  _Head_base<0UL,_chatra::Scope_*,_false> local_48;
  int local_3c;
  InstanceId local_38;
  
  pIVar5 = IdPool<chatra::InstanceId,_chatra::Instance>::lockAndRef
                     (&this->instanceIds,interactiveInstanceId);
  if (pIVar5 != (Instance *)0x0) {
    do {
      LOCK();
      _Var2 = (pIVar5->lockThreads).flag.super___atomic_flag_base._M_i;
      (pIVar5->lockThreads).flag.super___atomic_flag_base._M_i = true;
      UNLOCK();
    } while (_Var2 != false);
    p_Var6 = (pIVar5->threads)._M_h._M_before_begin._M_nxt;
    if (p_Var6 == (_Hash_node_base *)0x0) {
      __args = (Thread *)0x0;
    }
    else {
      __args = (Thread *)0x0;
      do {
        local_38 = interactiveInstanceId;
        if (*(char *)&p_Var6[2]._M_nxt[5]._M_nxt == '\x01') {
          if (((ulong)p_Var6[2]._M_nxt[5]._M_nxt & 0x100) == 0) {
            this_00 = (UnsupportedOperationException *)__cxa_allocate_exception(0x28);
            UnsupportedOperationException::UnsupportedOperationException
                      (this_00,"interaction instance (I%zu) is busy",local_38);
            __cxa_throw(this_00,&UnsupportedOperationException::typeinfo,
                        NativeException::~NativeException);
          }
          __args = (Thread *)p_Var6[2]._M_nxt;
        }
        p_Var6 = p_Var6->_M_nxt;
      } while (p_Var6 != (_Hash_node_base *)0x0);
    }
    (pIVar5->lockThreads).flag.super___atomic_flag_base._M_i = false;
    if (__args != (Thread *)0x0) {
      LOCK();
      (__args->readyToNextInteraction)._M_base._M_i = false;
      UNLOCK();
      __args_1 = IdPool<chatra::PackageId,_chatra::Package>::lockAndRef
                           (&this->packageIds,pIVar5->primaryPackageId);
      std::vector<chatra::Script,std::allocator<chatra::Script>>::
      emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((vector<chatra::Script,std::allocator<chatra::Script>> *)
                 &__args_1->super_PackageInfo,scriptName,statement);
      do {
        LOCK();
        _Var2 = (this->lockTrashNodes).flag.super___atomic_flag_base._M_i;
        (this->lockTrashNodes).flag.super___atomic_flag_base._M_i = true;
        UNLOCK();
      } while (_Var2 != false);
      p_Var7 = (_Fwd_list_node_base *)operator_new(0x18);
      p_Var7->_M_next = (_Fwd_list_node_base *)0x0;
      p_Var7[1]._M_next =
           (_Fwd_list_node_base *)
           (__args_1->node).super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var7[2]._M_next = (_Fwd_list_node_base *)0x0;
      p_Var3 = (__args_1->node).super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (__args_1->node).super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var7[2]._M_next = (_Fwd_list_node_base *)p_Var3;
      (__args_1->node).super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      p_Var7->_M_next =
           (this->trashNodes).
           super__Fwd_list_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           ._M_impl._M_head._M_next;
      (this->trashNodes).
      super__Fwd_list_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
      ._M_impl._M_head._M_next = p_Var7;
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xd0);
      p_Var8->_M_use_count = 1;
      p_Var8->_M_weak_count = 1;
      p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00246ba8;
      memset((element_type *)(p_Var8 + 1),0,0xc0);
      *(undefined4 *)((long)&p_Var8[4]._vptr__Sp_counted_base + 4) = 0xffffffff;
      p_Var8[4]._M_use_count = 0;
      p_Var8[4]._M_weak_count = 0;
      *(undefined1 *)&p_Var8[5]._vptr__Sp_counted_base = 0xff;
      *(undefined8 *)((long)&p_Var8[5]._vptr__Sp_counted_base + 4) = 0;
      *(undefined8 *)&p_Var8[5]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var8[6]._vptr__Sp_counted_base + 4) = 0;
      *(undefined8 *)&p_Var8[6]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var8[7]._vptr__Sp_counted_base + 4) = 0;
      *(undefined8 *)&p_Var8[7]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var8[8]._vptr__Sp_counted_base + 4) = 0;
      *(undefined8 *)&p_Var8[8]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var8[9]._vptr__Sp_counted_base + 4) = 0;
      *(undefined8 *)&p_Var8[9]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var8[10]._vptr__Sp_counted_base + 4) = 0;
      *(undefined8 *)&p_Var8[10]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var8[0xb]._vptr__Sp_counted_base + 4) = 0;
      *(undefined8 *)&p_Var8[0xb]._M_weak_count = 0;
      p_Var8[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var8[0xc]._M_use_count = 0;
      p_Var8[0xc]._M_weak_count = 0;
      (__args_1->node).super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(p_Var8 + 1);
      p_Var3 = (__args_1->node).super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (__args_1->node).super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var8;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      peVar4 = (__args_1->node).super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar4->type = ScriptRoot;
      puVar1 = &peVar4->flags;
      *(byte *)puVar1 = (byte)*puVar1 | 4;
      (this->lockTrashNodes).flag.super___atomic_flag_base._M_i = false;
      local_3c = 1;
      local_48._M_head_impl =
           (__args_1->scope)._M_t.
           super___uniq_ptr_impl<chatra::Scope,_std::default_delete<chatra::Scope>_>._M_t.
           super__Tuple_impl<0UL,_chatra::Scope_*,_std::default_delete<chatra::Scope>_>.
           super__Head_base<0UL,_chatra::Scope_*,_false>._M_head_impl;
      std::vector<chatra::Frame,std::allocator<chatra::Frame>>::
      emplace_back<chatra::Thread&,chatra::Package&,int,chatra::Scope*>
                ((vector<chatra::Frame,std::allocator<chatra::Frame>> *)&__args->frames,__args,
                 __args_1,&local_3c,&local_48._M_head_impl);
      Package::pushNodeFrame
                (__args_1,__args,__args_1,2,
                 (__args->scriptScope)._M_t.
                 super___uniq_ptr_impl<chatra::Scope,_std::default_delete<chatra::Scope>_>._M_t.
                 super__Tuple_impl<0UL,_chatra::Scope_*,_std::default_delete<chatra::Scope>_>.
                 super__Head_base<0UL,_chatra::Scope_*,_false>._M_head_impl,2);
      LOCK();
      (__args_1->initialized)._M_base._M_i = false;
      UNLOCK();
      __args_1->grouped = false;
      (__args->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].phase = 0x7ffffffffffffffc;
      enqueue(this,__args);
      return;
    }
  }
  puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar9 = 0;
  puVar9[1] = 0;
  puVar9[2] = 0;
  puVar9[3] = 0;
  puVar9[4] = 0;
  puVar9[1] = puVar9 + 3;
  puVar9[2] = 0;
  *(undefined1 *)(puVar9 + 3) = 0;
  *puVar9 = &PTR__NativeException_00245b18;
  __cxa_throw(puVar9,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
}

Assistant:

void RuntimeImp::push(InstanceId interactiveInstanceId, const std::string& scriptName,
		const std::string& statement) {

	auto* instance = instanceIds.lockAndRef(interactiveInstanceId);
	if (instance == nullptr)
		throw IllegalArgumentException();

	Thread* thread = nullptr;
	{
		std::lock_guard<SpinLock> lock0(instance->lockThreads);
		for (auto& e : instance->threads) {
			auto& t = e.second;
			if (!t->isInteractive)
				continue;
			if (!t->readyToNextInteraction.load())
				throw UnsupportedOperationException("interaction instance (I%zu) is busy",
						static_cast<size_t>(interactiveInstanceId));
			thread = t.get();
		}
	}
	if (thread == nullptr)
		throw IllegalArgumentException();

	thread->readyToNextInteraction = false;

	auto* package = packageIds.lockAndRef(instance->primaryPackageId);
	package->scripts.emplace_back(scriptName, statement);

	{
		std::lock_guard<SpinLock> lock0(lockTrashNodes);
		trashNodes.emplace_front(std::move(package->node));
		package->node = std::make_shared<Node>();
		package->node->type = NodeType::ScriptRoot;
		package->node->flags |= NodeFlags::InitialNode;
	}

	chatra_assert(thread->frames.size() == residentialFrameCount);
	thread->frames.emplace_back(*thread, *package, 1, package->scope.get());
	package->pushNodeFrame(*thread, *package, 2, thread->scriptScope.get(), 2);

	package->initialized = false;
	package->grouped = false;

	auto& f = thread->frames.back();
	chatra_assert(f.stack.empty());
	f.phase = Phase::ScriptRoot_InteractiveInitial;

	enqueue(thread);
}